

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessORow::operator()
          (ProcessORow *this,iterator_t *str,iterator_t end)

{
  uint uVar1;
  uint uVar2;
  ParserPOMDPFormat_Spirit *pPVar3;
  vector<double,_std::allocator<double>_> *__x;
  pointer puVar4;
  iterator __position;
  ObservationModelDiscrete *pOVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  uint uVar11;
  uint *puVar12;
  uint *local_1e8;
  vector<double,_std::allocator<double>_> local_1e0;
  uint *local_1c8;
  uint *local_1c0;
  uint local_1b8 [4];
  ostream local_1a8 [376];
  
  pPVar3 = this->_m_po;
  if ((long)(pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessORow:_m_lp_fromSI has size != 1. (at ",0x2c);
    poVar9 = POMDPFormatParsing::operator<<(local_1a8,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    std::endl<char,std::char_traits<char>>(poVar9);
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar10 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar10,&E::typeinfo,E::~E);
  }
  __x = (pPVar3->_m_curMatrix).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(pPVar3->_m_curMatrix).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)__x == 0x30) &&
     (__x[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      __x[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start)) {
    std::vector<double,_std::allocator<double>_>::vector(&local_1e0,__x);
    uVar6 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0x30))();
    uVar7 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0xd0))();
    if ((long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar7) {
      pPVar3 = this->_m_po;
      puVar4 = (pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*puVar4 == pPVar3->_m_anyStateIndex) {
        if ((pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar4) {
          (pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar4;
        }
        local_1b8[0] = 0;
        if (uVar6 != 0) {
          uVar8 = 0;
          do {
            pPVar3 = this->_m_po;
            __position._M_current =
                 (pPVar3->_m_lp_toSI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar3->_m_lp_toSI,
                         __position,local_1b8);
            }
            else {
              *__position._M_current = (uint)uVar8;
              (pPVar3->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            local_1b8[0] = local_1b8[0] + 1;
            uVar8 = (ulong)local_1b8[0];
          } while (uVar8 < uVar6);
        }
      }
      local_1e8 = (this->_m_po->_m_lp_toSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1c8 = (this->_m_po->_m_lp_toSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (local_1e8 != local_1c8) {
        do {
          puVar12 = (this->_m_po->_m_lp_JAI).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_1c0 = (this->_m_po->_m_lp_JAI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          if (puVar12 != local_1c0) {
            uVar1 = *local_1e8;
            do {
              if (uVar7 != 0) {
                uVar2 = *puVar12;
                uVar11 = 1;
                uVar6 = 0;
                do {
                  pOVar5 = (this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                           super_MultiAgentDecisionProcessDiscrete._m_p_oModel;
                  (*(pOVar5->super_ObservationModelDiscreteInterface).super_ObservationModel.
                    _vptr_ObservationModel[6])
                            (local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6],pOVar5,(ulong)uVar2,
                             (ulong)uVar1,(ulong)(uVar11 - 1));
                  uVar6 = (ulong)uVar11;
                  uVar11 = uVar11 + 1;
                } while (uVar6 < uVar7);
              }
              puVar12 = puVar12 + 1;
            } while (puVar12 != local_1c0);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != local_1c8);
      }
      if (local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessORow: exected a row matrix with nrJO=",0x2c);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," entries. Found ",0x10);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," entries. (at ",0xe);
    poVar9 = POMDPFormatParsing::operator<<(poVar9,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    std::endl<char,std::char_traits<char>>(poVar9);
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar10 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar10,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"ProcessORow: a row matrix should have been parsed. (at ",0x37);
  poVar9 = POMDPFormatParsing::operator<<(local_1a8,&str->_pos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
  std::endl<char,std::char_traits<char>>(poVar9);
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar10 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar10,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::ProcessORow::operator()(iterator_t str, iterator_t end) const
{
    if( _m_po->_m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessORow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessORow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetPOMDPDiscrete()->GetNrStates();
    size_t nrJO = _m_po->GetPOMDPDiscrete()->GetNrJointObservations();
    if( row.size() != nrJO)
    {
        stringstream ss; ss<<"ProcessORow: exected a row matrix with nrJO="<<nrJO<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_toSI.clear();
        for(Index si=0; si < nrS; si++)
            _m_po->_m_lp_toSI.push_back(si);
    }    
    vector<Index>::iterator sI_it = _m_po->_m_lp_toSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_toSI.end();
    while(sI_it != sI_last)
    {
        Index sucSI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            Index jaI = *jaI_it;
            for(Index joI=0; joI < nrJO; joI++)
            {
                _m_po->GetPOMDPDiscrete()->SetObservationProbability
                    (jaI, sucSI, joI, row[joI]);
                if(DEBUG_POMDP_PARSE)
                    cout << "Setting O("<<jaI<<","<<sucSI<<","<<joI<< ") = "<<row[joI]<<endl;
            }
            jaI_it++;
        }
        sI_it++;
    }
}